

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerAdapter::cmDebuggerAdapter
          (cmDebuggerAdapter *this,shared_ptr<cmDebugger::cmDebuggerConnection> *connection,
          string *dapLogPath)

{
  ulong uVar1;
  char *path;
  bool local_6e;
  shared_ptr<dap::ReaderWriter> local_60;
  byte local_4a;
  optional<std::shared_ptr<dap::Writer>_> local_48;
  shared_ptr<cmDebugger::cmDebuggerConnection> local_30;
  string *local_20;
  string *dapLogPath_local;
  shared_ptr<cmDebugger::cmDebuggerConnection> *connection_local;
  cmDebuggerAdapter *this_local;
  
  local_20 = dapLogPath;
  dapLogPath_local = (string *)connection;
  connection_local = &this->Connection;
  std::shared_ptr<cmDebugger::cmDebuggerConnection>::shared_ptr(&local_30,connection);
  uVar1 = std::__cxx11::string::empty();
  local_4a = 0;
  local_6e = (uVar1 & 1) != 0;
  if (local_6e) {
    std::optional<std::shared_ptr<dap::Writer>_>::optional(&local_48);
    local_4a = 1;
  }
  else {
    path = (char *)std::__cxx11::string::c_str();
    dap::file((dap *)&local_60,path);
    std::optional<std::shared_ptr<dap::Writer>_>::optional<std::shared_ptr<dap::ReaderWriter>,_true>
              (&local_48,&local_60);
  }
  local_6e = !local_6e;
  cmDebuggerAdapter(this,&local_30,&local_48);
  if (local_6e) {
    std::optional<std::shared_ptr<dap::Writer>_>::~optional(&local_48);
    std::shared_ptr<dap::ReaderWriter>::~shared_ptr(&local_60);
  }
  if ((local_4a & 1) != 0) {
    std::optional<std::shared_ptr<dap::Writer>_>::~optional(&local_48);
  }
  std::shared_ptr<cmDebugger::cmDebuggerConnection>::~shared_ptr(&local_30);
  return;
}

Assistant:

cmDebuggerAdapter::cmDebuggerAdapter(
  std::shared_ptr<cmDebuggerConnection> connection,
  std::string const& dapLogPath)
  : cmDebuggerAdapter(std::move(connection),
                      dapLogPath.empty()
                        ? cm::nullopt
                        : cm::optional<std::shared_ptr<dap::Writer>>(
                            dap::file(dapLogPath.c_str())))
{
}